

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freelist.h
# Opt level: O0

int * __thiscall MeCab::ChunkFreeList<int>::alloc(ChunkFreeList<int> *this,size_t req)

{
  int *piVar1;
  long lVar2;
  undefined1 auVar3 [16];
  size_type sVar4;
  reference pvVar5;
  unsigned_long *puVar6;
  vector<std::pair<unsigned_long,_int_*>,_std::allocator<std::pair<unsigned_long,_int_*>_>_>
  *this_00;
  ulong uVar7;
  unsigned_long in_RSI;
  long in_RDI;
  size_t _size;
  int *r;
  value_type *in_stack_ffffffffffffff98;
  unsigned_long local_18 [3];
  
  local_18[0] = in_RSI;
  while( true ) {
    uVar7 = *(ulong *)(in_RDI + 0x28);
    sVar4 = std::
            vector<std::pair<unsigned_long,_int_*>,_std::allocator<std::pair<unsigned_long,_int_*>_>_>
            ::size((vector<std::pair<unsigned_long,_int_*>,_std::allocator<std::pair<unsigned_long,_int_*>_>_>
                    *)(in_RDI + 8));
    if (sVar4 <= uVar7) {
      puVar6 = std::max<unsigned_long>(local_18,(unsigned_long *)(in_RDI + 0x30));
      this_00 = (vector<std::pair<unsigned_long,_int_*>,_std::allocator<std::pair<unsigned_long,_int_*>_>_>
                 *)(in_RDI + 8);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = *puVar6;
      uVar7 = SUB168(auVar3 * ZEXT816(4),0);
      if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
        uVar7 = 0xffffffffffffffff;
      }
      operator_new__(uVar7);
      std::make_pair<unsigned_long&,int*>
                ((unsigned_long *)this_00,(int **)in_stack_ffffffffffffff98);
      std::
      vector<std::pair<unsigned_long,_int_*>,_std::allocator<std::pair<unsigned_long,_int_*>_>_>::
      push_back(this_00,in_stack_ffffffffffffff98);
      sVar4 = std::
              vector<std::pair<unsigned_long,_int_*>,_std::allocator<std::pair<unsigned_long,_int_*>_>_>
              ::size((vector<std::pair<unsigned_long,_int_*>,_std::allocator<std::pair<unsigned_long,_int_*>_>_>
                      *)(in_RDI + 8));
      *(size_type *)(in_RDI + 0x28) = sVar4 - 1;
      *(unsigned_long *)(in_RDI + 0x20) = local_18[0] + *(long *)(in_RDI + 0x20);
      pvVar5 = std::
               vector<std::pair<unsigned_long,_int_*>,_std::allocator<std::pair<unsigned_long,_int_*>_>_>
               ::operator[]((vector<std::pair<unsigned_long,_int_*>,_std::allocator<std::pair<unsigned_long,_int_*>_>_>
                             *)(in_RDI + 8),*(size_type *)(in_RDI + 0x28));
      return pvVar5->second;
    }
    uVar7 = *(long *)(in_RDI + 0x20) + local_18[0];
    pvVar5 = std::
             vector<std::pair<unsigned_long,_int_*>,_std::allocator<std::pair<unsigned_long,_int_*>_>_>
             ::operator[]((vector<std::pair<unsigned_long,_int_*>,_std::allocator<std::pair<unsigned_long,_int_*>_>_>
                           *)(in_RDI + 8),*(size_type *)(in_RDI + 0x28));
    if (uVar7 < pvVar5->first) break;
    *(long *)(in_RDI + 0x28) = *(long *)(in_RDI + 0x28) + 1;
    *(undefined8 *)(in_RDI + 0x20) = 0;
  }
  pvVar5 = std::
           vector<std::pair<unsigned_long,_int_*>,_std::allocator<std::pair<unsigned_long,_int_*>_>_>
           ::operator[]((vector<std::pair<unsigned_long,_int_*>,_std::allocator<std::pair<unsigned_long,_int_*>_>_>
                         *)(in_RDI + 8),*(size_type *)(in_RDI + 0x28));
  piVar1 = pvVar5->second;
  lVar2 = *(long *)(in_RDI + 0x20);
  *(unsigned_long *)(in_RDI + 0x20) = local_18[0] + *(long *)(in_RDI + 0x20);
  return piVar1 + lVar2;
}

Assistant:

T* alloc(size_t req = 1) {
    while (li_ < freelist_.size()) {
      if ((pi_ + req) < freelist_[li_].first) {
        T *r = freelist_[li_].second + pi_;
        pi_ += req;
        return r;
      }
      li_++;
      pi_ = 0;
    }
    size_t _size = std::max(req, default_size);
    freelist_.push_back(std::make_pair(_size, new T[_size]));
    li_ = freelist_.size() - 1;
    pi_ += req;
    return freelist_[li_].second;
  }